

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# console.cpp
# Opt level: O0

int console::put_codepoint(char *utf8_codepoint,size_t length,int expectedWidth)

{
  int iVar1;
  int in_EDX;
  size_t in_RSI;
  void *in_RDI;
  winsize w;
  int width;
  int results;
  int y2;
  int x2;
  int y1;
  int x1;
  undefined1 local_3c [2];
  ushort local_3a;
  int local_34;
  int local_30;
  undefined1 local_2c [4];
  int local_28;
  undefined1 local_24 [4];
  int local_20;
  int local_1c;
  size_t local_18;
  void *local_10;
  int local_4;
  
  local_1c = in_EDX;
  if ((in_EDX < 0) && (tty != (FILE *)0x0)) {
    local_18 = in_RSI;
    local_10 = in_RDI;
    fputs("\x1b[6n",tty);
    local_30 = 0;
    local_30 = __isoc99_fscanf(tty,"\x1b[%d;%dR",local_24,&local_20);
    fwrite(local_10,local_18,1,tty);
    fputs("\x1b[6n",tty);
    iVar1 = __isoc99_fscanf(tty,"\x1b[%d;%dR",local_2c,&local_28);
    local_30 = iVar1 + local_30;
    if (local_30 == 4) {
      local_34 = local_28 - local_20;
      if (local_34 < 0) {
        ioctl(1,0x5413,local_3c);
        local_34 = (uint)local_3a + local_34;
      }
      local_4 = local_34;
    }
    else {
      local_4 = local_1c;
    }
  }
  else {
    fwrite(in_RDI,in_RSI,1,out);
    local_4 = local_1c;
  }
  return local_4;
}

Assistant:

static int put_codepoint(const char* utf8_codepoint, size_t length, int expectedWidth) {
#if defined(_WIN32)
        CONSOLE_SCREEN_BUFFER_INFO bufferInfo;
        if (!GetConsoleScreenBufferInfo(hConsole, &bufferInfo)) {
            // go with the default
            return expectedWidth;
        }
        COORD initialPosition = bufferInfo.dwCursorPosition;
        DWORD nNumberOfChars = length;
        WriteConsole(hConsole, utf8_codepoint, nNumberOfChars, &nNumberOfChars, NULL);

        CONSOLE_SCREEN_BUFFER_INFO newBufferInfo;
        GetConsoleScreenBufferInfo(hConsole, &newBufferInfo);

        // Figure out our real position if we're in the last column
        if (utf8_codepoint[0] != 0x09 && initialPosition.X == newBufferInfo.dwSize.X - 1) {
            DWORD nNumberOfChars;
            WriteConsole(hConsole, &" \b", 2, &nNumberOfChars, NULL);
            GetConsoleScreenBufferInfo(hConsole, &newBufferInfo);
        }

        int width = newBufferInfo.dwCursorPosition.X - initialPosition.X;
        if (width < 0) {
            width += newBufferInfo.dwSize.X;
        }
        return width;
#else
        // We can trust expectedWidth if we've got one
        if (expectedWidth >= 0 || tty == nullptr) {
            fwrite(utf8_codepoint, length, 1, out);
            return expectedWidth;
        }

        fputs("\033[6n", tty); // Query cursor position
        int x1;
        int y1;
        int x2;
        int y2;
        int results = 0;
        results = fscanf(tty, "\033[%d;%dR", &y1, &x1);

        fwrite(utf8_codepoint, length, 1, tty);

        fputs("\033[6n", tty); // Query cursor position
        results += fscanf(tty, "\033[%d;%dR", &y2, &x2);

        if (results != 4) {
            return expectedWidth;
        }

        int width = x2 - x1;
        if (width < 0) {
            // Calculate the width considering text wrapping
            struct winsize w;
            ioctl(STDOUT_FILENO, TIOCGWINSZ, &w);
            width += w.ws_col;
        }
        return width;
#endif
    }